

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O3

void __thiscall FTextureManager::ParseAnimatedDoor(FTextureManager *this,FScanner *sc)

{
  undefined1 *puVar1;
  uint *puVar2;
  uint uVar3;
  FDoorAnimation *pFVar4;
  bool bVar5;
  FTextureID FVar6;
  int iVar7;
  FTextureID FVar8;
  ulong uVar9;
  TArray<FTextureID,_FTextureID> frames;
  FDoorAnimation anim;
  TArray<FTextureID,_FTextureID> local_68;
  FTextureID local_50;
  undefined4 uStack_4c;
  FTextureID *pFStack_48;
  uint local_40;
  int local_3c;
  int iStack_38;
  
  local_3c = 0;
  iStack_38 = 0;
  local_68.Array = (FTextureID *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  FScanner::MustGetString(sc);
  FVar6 = CheckForTexture(this,sc->String,1,3);
  local_50 = FVar6;
  if (-1 < FVar6.texnum) {
    puVar1 = &((this->Textures).Array[(uint)FVar6.texnum].Texture)->field_0x31;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 1;
  }
LAB_00636709:
  do {
    bVar5 = FScanner::GetString(sc);
    if (!bVar5) {
LAB_00636848:
      if (-1 < FVar6.texnum) {
        uVar3 = local_68.Count;
        uVar9 = (ulong)local_68.Count;
        pFStack_48 = (FTextureID *)operator_new__(uVar9 * 4);
        memcpy(pFStack_48,local_68.Array,uVar9 * 4);
        local_40 = uVar3;
        TArray<FDoorAnimation,_FDoorAnimation>::Grow(&this->mAnimatedDoors,1);
        pFVar4 = (this->mAnimatedDoors).Array;
        uVar3 = (this->mAnimatedDoors).Count;
        pFVar4[uVar3].NumTextureFrames = local_40;
        *(ulong *)(pFVar4 + uVar3) = CONCAT44(uStack_4c,local_50.texnum);
        pFVar4[uVar3].TextureFrames = pFStack_48;
        pFVar4[uVar3].OpenSound.Index = local_3c;
        pFVar4[uVar3].CloseSound.Index = iStack_38;
        puVar2 = &(this->mAnimatedDoors).Count;
        *puVar2 = *puVar2 + 1;
      }
      TArray<FTextureID,_FTextureID>::~TArray(&local_68);
      return;
    }
    bVar5 = FScanner::Compare(sc,"opensound");
    if (!bVar5) {
      bVar5 = FScanner::Compare(sc,"closesound");
      if (bVar5) {
        FScanner::MustGetString(sc);
        iStack_38 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      }
      else {
        bVar5 = FScanner::Compare(sc,"pic");
        if (bVar5) {
          FScanner::MustGetString(sc);
          bVar5 = IsNum(sc->String);
          if (bVar5) {
            iVar7 = atoi(sc->String);
            FVar8 = FTextureID::operator+(&local_50,iVar7 + -1);
          }
          else {
            FVar8 = CheckForTexture(this,sc->String,1,3);
            if ((FVar8.texnum < 0) && (-1 < (local_50.texnum | FVar6.texnum))) {
              FScanner::ScriptError(sc,"Unknown texture %s",sc->String);
            }
          }
          TArray<FTextureID,_FTextureID>::Grow(&local_68,1);
          local_68.Array[local_68.Count].texnum = FVar8.texnum;
          local_68.Count = local_68.Count + 1;
        }
        else {
          bVar5 = FScanner::Compare(sc,"allowdecals");
          if (!bVar5) {
            FScanner::UnGet(sc);
            goto LAB_00636848;
          }
          if (-1 < (long)local_50.texnum) {
            puVar1 = &((this->Textures).Array[local_50.texnum].Texture)->field_0x31;
            *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
          }
        }
      }
      goto LAB_00636709;
    }
    FScanner::MustGetString(sc);
    local_3c = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  } while( true );
}

Assistant:

void FTextureManager::ParseAnimatedDoor(FScanner &sc)
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	FDoorAnimation anim;
	TArray<FTextureID> frames;
	bool error = false;
	FTextureID v;

	sc.MustGetString();
	anim.BaseTexture = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);

	if (!anim.BaseTexture.Exists())
	{
		error = true;
	}
	else
	{
		Texture(anim.BaseTexture)->bNoDecals = true;
	}
	while (sc.GetString())
	{
		if (sc.Compare ("opensound"))
		{
			sc.MustGetString ();
			anim.OpenSound = sc.String;
		}
		else if (sc.Compare ("closesound"))
		{
			sc.MustGetString ();
			anim.CloseSound = sc.String;
		}
		else if (sc.Compare ("pic"))
		{
			sc.MustGetString ();
			if (IsNum (sc.String))
			{
				v = anim.BaseTexture + (atoi(sc.String) - 1);
			}
			else
			{
				v = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);
				if (!v.Exists() && anim.BaseTexture.Exists() && !error)
				{
					sc.ScriptError ("Unknown texture %s", sc.String);
				}
			}
			frames.Push(v);
		}
		else if (sc.Compare("allowdecals"))
		{
			if (anim.BaseTexture.Exists()) Texture(anim.BaseTexture)->bNoDecals = false;
		}
		else
		{
			sc.UnGet ();
			break;
		}
	}
	if (!error)
	{
		anim.TextureFrames = new FTextureID[frames.Size()];
		memcpy (anim.TextureFrames, &frames[0], sizeof(FTextureID) * frames.Size());
		anim.NumTextureFrames = frames.Size();
		mAnimatedDoors.Push (anim);
	}
}